

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O2

void __thiscall ArcflowSol::print_solution(ArcflowSol *this,bool print_inst,bool pyout)

{
  pointer pvVar1;
  pointer ppVar2;
  pair<int,_int> pVar3;
  pair<int,_int> pVar4;
  pointer pIVar5;
  bool bVar6;
  long lVar7;
  undefined7 in_register_00000011;
  pointer ppVar8;
  int i;
  int iVar9;
  undefined7 in_register_00000031;
  ulong uVar10;
  int_pair *itpair;
  pointer ppVar11;
  pointer ppVar12;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  pair<int,_int> local_48;
  undefined4 local_40;
  undefined4 local_3c;
  ArcflowSol *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,pyout);
  local_40 = (undefined4)CONCAT71(in_register_00000031,print_inst);
  printf("Objective: %d\n",(ulong)(uint)this->objvalue);
  puts("Solution:");
  local_38 = this;
  for (lVar7 = 0; iVar9 = (this->inst).nbtypes, lVar7 < iVar9; lVar7 = lVar7 + 1) {
    if (1 < iVar9) {
      printf("Bins of type %d: %d\n",(ulong)((int)lVar7 + 1),
             (ulong)(uint)(this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7]);
    }
    pvVar1 = (this->sols).
             super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = *(pointer *)
              ((long)&pvVar1[lVar7].
                      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (ppVar8 = pvVar1[lVar7].
                  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar2; ppVar8 = ppVar8 + 1)
    {
      tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ppVar12 = *(pointer *)
                 ((long)&(ppVar8->second).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl + 8);
      for (ppVar11 = (ppVar8->second).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar12;
          ppVar11 = ppVar11 + 1) {
        pIVar5 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_start + ppVar11->first;
        pVar3.first = pIVar5->type;
        pVar3.second = pIVar5->opt;
        for (iVar9 = 0; iVar9 < ppVar11->second; iVar9 = iVar9 + 1) {
          local_48 = pVar3;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&tmp,&local_48
                    );
        }
        this = local_38;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      printf("%d x [",(ulong)(uint)ppVar8->first);
      ppVar11 = tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      bVar6 = true;
      for (ppVar12 = tmp.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar11;
          ppVar12 = ppVar12 + 1) {
        if (!bVar6) {
          printf(", ");
        }
        uVar10 = (ulong)(ppVar12->first + 1);
        if (ppVar12->second == -1) {
          printf("i=%d",uVar10);
        }
        else {
          printf("i=%d opt=%d",uVar10,(ulong)(ppVar12->second + 1));
        }
        bVar6 = false;
      }
      puts("]");
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&tmp);
    }
  }
  if ((char)local_40 != '\0') {
    Instance::print(&this->inst);
  }
  if ((char)local_3c != '\0') {
    printf("PYSOL=(%d,[",(ulong)(uint)this->objvalue);
    for (lVar7 = 0; lVar7 < (this->inst).nbtypes; lVar7 = lVar7 + 1) {
      putchar(0x5b);
      pvVar1 = (this->sols).
               super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = *(pointer *)
                ((long)&pvVar1[lVar7].
                        super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (ppVar8 = pvVar1[lVar7].
                    super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar2; ppVar8 = ppVar8 + 1
          ) {
        tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ppVar12 = *(pointer *)
                   ((long)&(ppVar8->second).
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl + 8);
        for (ppVar11 = (ppVar8->second).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar12;
            ppVar11 = ppVar11 + 1) {
          pIVar5 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                   super__Vector_impl_data._M_start + ppVar11->first;
          pVar4.first = pIVar5->type;
          pVar4.second = pIVar5->opt;
          for (iVar9 = 0; iVar9 < ppVar11->second; iVar9 = iVar9 + 1) {
            local_48 = pVar4;
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&tmp,
                       &local_48);
          }
          this = local_38;
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (tmp.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   tmp.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        printf("(%d,[",(ulong)(uint)ppVar8->first);
        ppVar11 = tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar12 = tmp.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar11;
            ppVar12 = ppVar12 + 1) {
          if (ppVar12->second == -1) {
            printf("(%d, 0),",(ulong)(uint)ppVar12->first);
          }
          else {
            printf("(%d, %d),",(ulong)(uint)ppVar12->first);
          }
        }
        printf("]),");
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&tmp)
        ;
      }
      printf("],");
    }
    puts("])");
  }
  return;
}

Assistant:

void ArcflowSol::print_solution(bool print_inst = true, bool pyout = false) {
	printf("Objective: %d\n", objvalue);
	printf("Solution:\n");
	for (int t = 0; t < inst.nbtypes; t++) {
		if (inst.nbtypes > 1) {
			printf("Bins of type %d: %d\n", t + 1, nbins[t]);
		}
		std::vector<pattern_pair> &sol = sols[t];
		for (const pattern_pair &pat : sol) {
			std::vector<int_pair> tmp;
			for (const int_pair &itpair : pat.second) {
				int t = inst.items[itpair.first].type;
				int opt = inst.items[itpair.first].opt;
				for (int i = 0; i < itpair.second; i++) {
					tmp.push_back(MP(t, opt));
				}
			}
			sort(all(tmp));
			printf("%d x [", pat.first);
			bool first = true;
			for (const int_pair &p : tmp) {
				if (first) {
					first = false;
				} else {
					printf(", ");
				}
				if (p.second == -1) {
					printf("i=%d", p.first + 1);
				} else {
					printf("i=%d opt=%d", p.first + 1, p.second + 1);
				}
			}
			printf("]\n");
		}
	}

	if (print_inst) {
		inst.print();
	}

	if (pyout) {
		printf("PYSOL=(%d,[", objvalue);
		for (int t = 0; t < inst.nbtypes; t++) {
			printf("[");
			std::vector<pattern_pair> &sol = sols[t];
			for (const pattern_pair &pat : sol) {
				std::vector<int_pair> tmp;
				for (const int_pair &itpair : pat.second) {
					int t = inst.items[itpair.first].type;
					int opt = inst.items[itpair.first].opt;
					for (int i = 0; i < itpair.second; i++) {
						tmp.push_back(MP(t, opt));
					}
				}
				sort(all(tmp));

				printf("(%d,[", pat.first);
				for (const int_pair &p : tmp) {
					if (p.second == -1) {
						printf("(%d, 0),", p.first);
					} else {
						printf("(%d, %d),", p.first, p.second);
					}
				}
				printf("]),");
			}
			printf("],");
		}
		printf("])\n");
	}
}